

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginGroup(void)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiGroupData *pIVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  ImGuiGroupData *__dest;
  int iVar8;
  int iVar9;
  ImGuiContext *ctx;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  iVar2 = (GImGui->GroupStack).Size;
  iVar9 = iVar2 + 1;
  iVar3 = (GImGui->GroupStack).Capacity;
  if (iVar3 <= iVar2) {
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar8 <= iVar9) {
      iVar8 = iVar9;
    }
    if (iVar3 < iVar8) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiGroupData *)(*GImAllocatorAllocFunc)((long)iVar8 * 0x30,GImAllocatorUserData);
      pIVar5 = (pIVar7->GroupStack).Data;
      if (pIVar5 != (ImGuiGroupData *)0x0) {
        memcpy(__dest,pIVar5,(long)(pIVar7->GroupStack).Size * 0x30);
        pIVar5 = (pIVar7->GroupStack).Data;
        if ((pIVar5 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar7->GroupStack).Data = __dest;
      (pIVar7->GroupStack).Capacity = iVar8;
    }
  }
  (pIVar7->GroupStack).Size = iVar9;
  pIVar5 = (pIVar7->GroupStack).Data;
  pIVar5[iVar2].WindowID = pIVar4->ID;
  pIVar5[iVar2].BackupCursorPos = (pIVar4->DC).CursorPos;
  pIVar5[iVar2].BackupCursorMaxPos = (pIVar4->DC).CursorMaxPos;
  pIVar5[iVar2].BackupIndent.x = (pIVar4->DC).Indent.x;
  pIVar5[iVar2].BackupGroupOffset.x = (pIVar4->DC).GroupOffset.x;
  pIVar5[iVar2].BackupCurrLineSize = (pIVar4->DC).CurrLineSize;
  pIVar5[iVar2].BackupCurrLineTextBaseOffset = (pIVar4->DC).CurrLineTextBaseOffset;
  pIVar5[iVar2].BackupActiveIdIsAlive = pIVar7->ActiveIdIsAlive;
  pIVar5[iVar2].BackupHoveredIdIsAlive = pIVar7->HoveredId != 0;
  pIVar5[iVar2].BackupActiveIdPreviousFrameIsAlive = pIVar7->ActiveIdPreviousFrameIsAlive;
  pIVar5[iVar2].EmitItem = true;
  fVar6 = ((pIVar4->DC).CursorPos.x - (pIVar4->Pos).x) - (pIVar4->DC).ColumnsOffset.x;
  (pIVar4->DC).GroupOffset.x = fVar6;
  (pIVar4->DC).Indent.x = fVar6;
  (pIVar4->DC).CursorMaxPos = (pIVar4->DC).CursorPos;
  (pIVar4->DC).CurrLineSize.x = 0.0;
  (pIVar4->DC).CurrLineSize.y = 0.0;
  if (pIVar7->LogEnabled == true) {
    pIVar7->LogLinePosY = -3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupHoveredIdIsAlive = g.HoveredId != 0;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}